

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::GetContentRegionMax(void)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  
  pIVar2 = GImGui->CurrentWindow;
  fVar1 = (pIVar2->ContentRegionRect).Max.x;
  if ((pIVar2->DC).CurrentColumns != (ImGuiColumns *)0x0) {
    fVar1 = (pIVar2->WorkRect).Max.x;
  }
  IVar3.y = (pIVar2->ContentRegionRect).Max.y - (pIVar2->Pos).y;
  IVar3.x = fVar1 - (pIVar2->Pos).x;
  return IVar3;
}

Assistant:

ImVec2 ImGui::GetContentRegionMax()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImVec2 mx = window->ContentRegionRect.Max - window->Pos;
    if (window->DC.CurrentColumns)
        mx.x = window->WorkRect.Max.x - window->Pos.x;
    return mx;
}